

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_uv.cc
# Opt level: O2

int UVScale(uint8_t *src_uv,int src_stride_uv,int src_width,int src_height,uint8_t *dst_uv,
           int dst_stride_uv,int dst_width,int dst_height,FilterMode filtering)

{
  uint uVar1;
  FilterMode filtering_00;
  int iVar2;
  int iVar3;
  int iVar4;
  code *pcVar5;
  long lVar6;
  uint8_t *puVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  code *pcVar13;
  uint8_t *puVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  uint8_t *local_b8;
  uint8_t *local_a8;
  int y;
  code *local_80;
  int x;
  uint8_t *local_70;
  ulong local_68;
  code *local_60;
  code *local_58;
  code *local_50;
  uint8_t *local_48;
  uint local_40;
  int dx;
  uint8_t *local_38;
  
  if (dst_height < 1) {
    return -1;
  }
  if (dst_width < 1) {
    return -1;
  }
  if (dst_uv == (uint8_t *)0x0) {
    return -1;
  }
  if (0x8000 < src_height) {
    return -1;
  }
  if (0x8000 < src_width) {
    return -1;
  }
  if (src_uv == (uint8_t *)0x0) {
    return -1;
  }
  if (src_width == 0) {
    return -1;
  }
  if (src_height == 0) {
    return -1;
  }
  x = 0;
  y = 0;
  dx = 0;
  local_40 = 0;
  filtering_00 = ScaleFilterReduce(src_width,src_height,dst_width,dst_height,filtering);
  local_b8 = src_uv;
  if (src_height < 0) {
    local_b8 = src_uv + ~src_height * src_stride_uv;
    src_stride_uv = -src_stride_uv;
    src_height = -src_height;
  }
  ScaleSlope(src_width,src_height,dst_width,dst_height,filtering_00,&x,&y,&dx,(int *)&local_40);
  uVar1 = local_40;
  uVar9 = y;
  uVar11 = (ulong)(uint)-src_width;
  if (0 < src_width) {
    uVar11 = (ulong)(uint)src_width;
  }
  local_80 = (code *)(long)dx;
  local_a8 = dst_uv;
  if ((short)(local_40 | dx) == 0) {
    if (local_40 == 0 || dx == 0) {
      filtering_00 = kFilterNone;
    }
    else {
      uVar8 = x >> 0xf;
      if (((local_40 | dx) >> 0x10 & 1) == 0) {
        iVar2 = (int)local_40 >> 0x10;
        if (dx == 0x20000) {
          if (filtering_00 == kFilterLinear) {
            pcVar13 = ScaleUVRowDown2Linear_C;
            iVar3 = 0;
          }
          else {
            pcVar13 = ScaleUVRowDown2Box_C;
            iVar3 = src_stride_uv;
          }
          if (filtering_00 == kFilterNone) {
            pcVar13 = ScaleUVRowDown2_C;
          }
          iVar12 = (int)y._2_2_;
          iVar4 = libyuv::TestCpuFlag(0x40);
          if ((dst_width & 3U) == 0) {
            pcVar5 = ScaleUVRowDown2Box_SSSE3;
          }
          else {
            pcVar5 = ScaleUVRowDown2Box_Any_SSSE3;
          }
          if (iVar4 == 0) {
            pcVar5 = pcVar13;
          }
          if (filtering_00 == kFilterNone) {
            pcVar5 = pcVar13;
          }
          iVar4 = libyuv::TestCpuFlag(0x400);
          if ((dst_width & 7U) == 0) {
            local_80 = ScaleUVRowDown2Box_AVX2;
          }
          else {
            local_80 = ScaleUVRowDown2Box_Any_AVX2;
          }
          if (iVar4 == 0) {
            local_80 = pcVar5;
          }
          if (filtering_00 == kFilterNone) {
            local_80 = pcVar5;
          }
          uVar9 = (uVar8 & 0xfffffffe) - 2;
          if (filtering_00 == kFilterBilinear) {
            uVar9 = uVar8 & 0xfffffffe;
          }
          local_b8 = local_b8 + (int)(uVar9 + iVar12 * src_stride_uv);
          while (bVar18 = dst_height != 0, dst_height = dst_height + -1, bVar18) {
            (*local_80)(local_b8,(long)iVar3,local_a8,dst_width);
            local_b8 = local_b8 + iVar2 * src_stride_uv;
            local_a8 = local_a8 + dst_stride_uv;
          }
          return 0;
        }
        iVar3 = y >> 0x10;
        if (filtering_00 != kFilterBox || dx != 0x40000) {
          if (filtering_00 == kFilterNone) {
            pcVar13 = ScaleUVRowDownEven_C;
          }
          else {
            pcVar13 = ScaleUVRowDownEvenBox_C;
          }
          local_80 = (code *)(ulong)(uint)(dx >> 0x10);
          local_b8 = local_b8 + (int)((uVar8 & 0xfffffffe) + iVar3 * src_stride_uv);
          iVar3 = 0;
          if (filtering_00 != kFilterLinear) {
            iVar3 = src_stride_uv;
          }
          while (bVar18 = dst_height != 0, dst_height = dst_height + -1, bVar18) {
            (*pcVar13)(local_b8,(long)iVar3,local_80,local_a8,dst_width);
            local_b8 = local_b8 + iVar2 * src_stride_uv;
            local_a8 = local_a8 + dst_stride_uv;
          }
          return 0;
        }
        uVar9 = dst_width * 4 + 0xfU & 0xfffffff0;
        local_80 = (code *)(ulong)uVar9;
        puVar7 = (uint8_t *)malloc((ulong)(uVar9 * 2 + 0x3f));
        iVar4 = libyuv::TestCpuFlag(0x40);
        if ((dst_width & 3U) == 0) {
          pcVar13 = ScaleUVRowDown2Box_SSSE3;
        }
        else {
          pcVar13 = ScaleUVRowDown2Box_Any_SSSE3;
        }
        if (iVar4 == 0) {
          pcVar13 = ScaleUVRowDown2Box_C;
        }
        uVar11 = (ulong)(puVar7 + 0x3f) & 0xffffffffffffffc0;
        iVar4 = libyuv::TestCpuFlag(0x400);
        if ((dst_width & 7U) == 0) {
          pcVar5 = ScaleUVRowDown2Box_AVX2;
        }
        else {
          pcVar5 = ScaleUVRowDown2Box_Any_AVX2;
        }
        local_b8 = local_b8 + (int)(iVar3 * src_stride_uv + (uVar8 & 0xfffffffe));
        if (iVar4 == 0) {
          pcVar5 = pcVar13;
        }
        lVar6 = (long)local_80 + uVar11;
        local_68 = (ulong)(iVar2 * src_stride_uv);
        local_60 = (code *)(long)dst_stride_uv;
        local_70 = puVar7;
        while (bVar18 = dst_height != 0, dst_height = dst_height + -1, puVar7 = local_70, bVar18) {
          (*pcVar5)(local_b8,(long)src_stride_uv,uVar11,dst_width * 2);
          (*pcVar5)(local_b8 + src_stride_uv * 2,(long)src_stride_uv,lVar6,dst_width * 2);
          (*pcVar5)(uVar11,local_80,local_a8,dst_width);
          local_b8 = local_b8 + local_68;
          local_a8 = local_a8 + (long)local_60;
        }
        goto LAB_0014facd;
      }
      if ((((dx & local_40) >> 0x10 & 1) != 0) &&
         (filtering_00 = kFilterNone, local_40 == 0x10000 && dx == 0x10000)) {
        if (local_b8 == (uint8_t *)0x0) {
          return 0;
        }
        CopyPlane(local_b8 + (long)(y._2_2_ * src_stride_uv) + (long)(int)(uVar8 & 0xfffffffe),
                  src_stride_uv,dst_uv,dst_stride_uv,dst_width * 2,dst_height);
        return 0;
      }
    }
  }
  local_68 = (ulong)(uint)x;
  if ((x & 0xffffU) == 0 && dx == 0x10000) {
    ScalePlaneVertical(src_height,dst_width,dst_height,src_stride_uv,dst_stride_uv,local_b8,dst_uv,x
                       ,y,local_40,4,filtering_00);
    return 0;
  }
  uVar8 = (uint)uVar11;
  if ((int)local_40 < 0x10000 && filtering_00 != kFilterNone) {
    iVar2 = libyuv::TestCpuFlag(0x40);
    if ((dst_width & 3U) == 0) {
      pcVar13 = InterpolateRow_SSSE3;
    }
    else {
      pcVar13 = InterpolateRow_Any_SSSE3;
    }
    if (iVar2 == 0) {
      pcVar13 = InterpolateRow_C;
    }
    local_58._0_4_ = src_height << 0x10;
    iVar2 = libyuv::TestCpuFlag(0x400);
    if ((dst_width & 7U) == 0) {
      pcVar5 = InterpolateRow_AVX2;
    }
    else {
      pcVar5 = InterpolateRow_Any_AVX2;
    }
    local_58._0_4_ = (uint)local_58 - 0x10000;
    if (iVar2 == 0) {
      pcVar5 = pcVar13;
    }
    if (uVar8 < 0x8000) {
      local_50 = ScaleUVFilterCols_C;
    }
    else {
      local_50 = ScaleUVFilterCols64_C;
    }
    if ((int)(uint)local_58 < (int)uVar9) {
      uVar9 = (uint)local_58;
    }
    iVar2 = (int)uVar9 >> 0x10;
    local_60 = (code *)CONCAT44(local_60._4_4_,dst_width * 2);
    uVar8 = dst_width * 2 + 0xfU & 0xfffffff0;
    local_70 = local_b8 + iVar2 * src_stride_uv;
    local_38 = (uint8_t *)malloc((ulong)(uVar8 * 2 + 0x3f));
    pcVar13 = local_50;
    uVar11 = (ulong)(local_38 + 0x3f) & 0xffffffffffffffc0;
    (*local_50)(uVar11,local_b8 + iVar2 * src_stride_uv,dst_width,local_68,local_80);
    local_48 = (uint8_t *)(long)src_stride_uv;
    puVar14 = (uint8_t *)0x0;
    if (1 < (uint)src_height) {
      puVar14 = local_48;
    }
    puVar14 = puVar14 + (long)local_70;
    local_70 = (uint8_t *)(ulong)uVar8;
    (*pcVar13)((uint8_t *)(ulong)uVar8 + uVar11,puVar14,dst_width,local_68,local_80);
    puVar14 = puVar14 + (long)local_48;
    iVar3 = (int)(uint)local_58 >> 0x10;
    while (bVar18 = dst_height != 0, dst_height = dst_height + -1, puVar7 = local_38, bVar18) {
      if ((int)uVar9 >> 0x10 != iVar2) {
        iVar4 = (int)uVar9 >> 0x10;
        if ((int)(uint)local_58 < (int)uVar9) {
          puVar14 = local_b8 + src_stride_uv * iVar3;
          iVar4 = iVar3;
        }
        if ((int)(uint)local_58 <= (int)uVar9) {
          uVar9 = (uint)local_58;
        }
        if (iVar4 != iVar2) {
          (*local_50)(uVar11,puVar14,dst_width,local_68,local_80);
          uVar11 = uVar11 + (long)(int)local_70;
          local_70 = (uint8_t *)(ulong)(uint)-(int)local_70;
          puVar14 = puVar14 + (long)local_48;
          iVar2 = iVar4;
        }
      }
      if (filtering_00 == kFilterLinear) {
        lVar6 = 0;
        uVar8 = 0;
      }
      else {
        uVar8 = uVar9 >> 8 & 0xff;
        lVar6 = (long)(int)local_70;
      }
      (*pcVar5)(dst_uv,uVar11,lVar6,local_60._0_4_,uVar8);
      dst_uv = dst_uv + dst_stride_uv;
      uVar9 = uVar9 + uVar1;
    }
  }
  else {
    if (filtering_00 == kFilterNone) {
      if (uVar8 < 0x8000) {
        pcVar13 = ScaleUVCols_C;
      }
      else {
        pcVar13 = ScaleUVCols64_C;
      }
      pcVar5 = pcVar13;
      if (x < 0x8000) {
        pcVar5 = ScaleUVColsUp2_C;
      }
      if (uVar8 * 2 == dst_width) {
        pcVar13 = pcVar5;
      }
      iVar2 = y;
      while (bVar18 = dst_height != 0, dst_height = dst_height + -1, bVar18) {
        (*pcVar13)(local_a8,local_b8 + (iVar2 >> 0x10) * src_stride_uv,dst_width,local_68,local_80);
        local_a8 = local_a8 + dst_stride_uv;
        iVar2 = iVar2 + uVar1;
      }
      return 0;
    }
    lVar6 = (long)x;
    if (uVar8 < 0x8000) {
      local_60 = ScaleUVFilterCols_C;
    }
    else {
      local_60 = ScaleUVFilterCols64_C;
    }
    lVar15 = (ulong)(dst_width - 1) * (long)local_80 + lVar6;
    lVar16 = lVar15;
    if (dx < 0) {
      lVar16 = lVar6;
      lVar6 = lVar15;
    }
    uVar10 = lVar6 >> 0x10 & 0xfffffffffffffffc;
    uVar17 = (lVar16 >> 0x10) + 5U & 0xfffffffffffffffc;
    if ((long)uVar11 <= (long)uVar17) {
      uVar17 = uVar11;
    }
    uVar8 = (int)uVar17 - (int)uVar10;
    iVar2 = libyuv::TestCpuFlag(0x40);
    if ((uVar8 & 7) == 0) {
      pcVar13 = InterpolateRow_SSSE3;
    }
    else {
      pcVar13 = InterpolateRow_Any_SSSE3;
    }
    if (iVar2 == 0) {
      pcVar13 = InterpolateRow_C;
    }
    iVar2 = libyuv::TestCpuFlag(0x400);
    if ((uVar8 & 0xf) == 0) {
      local_58 = InterpolateRow_AVX2;
    }
    else {
      local_58 = InterpolateRow_Any_AVX2;
    }
    local_50 = (code *)CONCAT44(local_50._4_4_,uVar8 * 2);
    local_70 = local_b8 + uVar10 * 2;
    local_68 = (ulong)((int)local_68 + ((uint)((ulong)lVar6 >> 0x10) & 0xfffffffc) * -0x10000);
    if (iVar2 == 0) {
      local_58 = pcVar13;
    }
    local_48 = (uint8_t *)malloc((long)(int)(uVar8 * 4 + 0x3f));
    puVar14 = local_48 + 0x3f;
    uVar8 = src_height * 0x10000 - 0x10000;
    if ((int)uVar8 < (int)uVar9) {
      uVar9 = uVar8;
    }
    while (bVar18 = dst_height != 0, dst_height = dst_height + -1, puVar7 = local_48, bVar18) {
      puVar7 = local_70 + ((int)uVar9 >> 0x10) * src_stride_uv;
      if (filtering_00 != kFilterLinear) {
        (*local_58)((uint8_t *)((ulong)puVar14 & 0xffffffffffffffc0),puVar7,(long)src_stride_uv,
                    (ulong)local_50 & 0xffffffff,uVar9 >> 8 & 0xff);
        puVar7 = (uint8_t *)((ulong)puVar14 & 0xffffffffffffffc0);
      }
      (*local_60)(dst_uv,puVar7,dst_width,local_68,local_80);
      dst_uv = dst_uv + dst_stride_uv;
      uVar9 = uVar9 + uVar1;
      if ((int)uVar8 <= (int)uVar9) {
        uVar9 = uVar8;
      }
    }
  }
LAB_0014facd:
  free(puVar7);
  return 0;
}

Assistant:

LIBYUV_API
int UVScale(const uint8_t* src_uv,
            int src_stride_uv,
            int src_width,
            int src_height,
            uint8_t* dst_uv,
            int dst_stride_uv,
            int dst_width,
            int dst_height,
            enum FilterMode filtering) {
  if (!src_uv || src_width == 0 || src_height == 0 || src_width > 32768 ||
      src_height > 32768 || !dst_uv || dst_width <= 0 || dst_height <= 0) {
    return -1;
  }
  ScaleUV(src_uv, src_stride_uv, src_width, src_height, dst_uv, dst_stride_uv,
          dst_width, dst_height, 0, 0, dst_width, dst_height, filtering);
  return 0;
}